

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSDDOMParser.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::XSDDOMParser::endAnnotationElement
          (XSDDOMParser *this,XMLElementDecl *elemDecl,bool complete)

{
  DOMDocumentImpl *pDVar1;
  DOMNode *pDVar2;
  int iVar3;
  XMLCh *pXVar4;
  undefined4 extraout_var;
  DOMTextImpl *node;
  bool complete_local;
  XMLElementDecl *elemDecl_local;
  XSDDOMParser *this_local;
  
  if (complete) {
    XMLBuffer::append(&this->fAnnotationBuf,L'\n');
    XMLBuffer::append(&this->fAnnotationBuf,L'<');
    XMLBuffer::append(&this->fAnnotationBuf,L'/');
    pXVar4 = XMLElementDecl::getFullName(elemDecl);
    XMLBuffer::append(&this->fAnnotationBuf,pXVar4);
    XMLBuffer::append(&this->fAnnotationBuf,L'>');
    pDVar1 = (this->super_XercesDOMParser).super_AbstractDOMParser.fDocument;
    pXVar4 = XMLBuffer::getRawBuffer(&this->fAnnotationBuf);
    iVar3 = (*(pDVar1->super_DOMMemoryManager)._vptr_DOMMemoryManager[0x3e])(pDVar1,pXVar4);
    pDVar2 = (this->super_XercesDOMParser).super_AbstractDOMParser.fCurrentNode;
    (*pDVar2->_vptr_DOMNode[0x11])(pDVar2,CONCAT44(extraout_var,iVar3));
    XMLBuffer::reset(&this->fAnnotationBuf);
  }
  else {
    XMLBuffer::append(&this->fAnnotationBuf,L'<');
    XMLBuffer::append(&this->fAnnotationBuf,L'/');
    pXVar4 = XMLElementDecl::getFullName(elemDecl);
    XMLBuffer::append(&this->fAnnotationBuf,pXVar4);
    XMLBuffer::append(&this->fAnnotationBuf,L'>');
  }
  return;
}

Assistant:

void XSDDOMParser::endAnnotationElement( const XMLElementDecl& elemDecl
                                       , bool complete)
{
    if (complete)
    {
        fAnnotationBuf.append(chLF);
        fAnnotationBuf.append(chOpenAngle);
        fAnnotationBuf.append(chForwardSlash);
        fAnnotationBuf.append(elemDecl.getFullName());
        fAnnotationBuf.append(chCloseAngle);

        // note that this is always called after endElement on <annotation>'s
        // child and before endElement on annotation.
        // hence, we must make this the child of the current
        // parent's only child.
        DOMTextImpl *node = (DOMTextImpl *)fDocument->createTextNode(fAnnotationBuf.getRawBuffer());
        fCurrentNode->appendChild(node);
        fAnnotationBuf.reset();
    }
    else      //capturing character calls
    {
        fAnnotationBuf.append(chOpenAngle);
        fAnnotationBuf.append(chForwardSlash);
        fAnnotationBuf.append(elemDecl.getFullName());
        fAnnotationBuf.append(chCloseAngle);
    }
}